

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
               (pair<int,_int> *begin,
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               end,int param_3,byte param_4)

{
  pair<int,_int> pVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var5;
  int __tmp;
  pair<int,_int> *ppVar6;
  int iVar7;
  pair<int,_int> *ppVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var13;
  int iVar14;
  int iVar15;
  pair<int,_int> *ppVar16;
  long lVar17;
  pair<int,_int> *ppVar18;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  __first;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_bool>
  pVar19;
  _Iter_comp_iter<std::less<std::pair<int,_int>_>_> __cmp;
  _Iter_comp_iter<std::less<std::pair<int,_int>_>_> __cmp_1;
  _Iter_comp_iter<std::less<std::pair<int,_int>_>_> local_4e;
  _Iter_comp_iter<std::less<std::pair<int,_int>_>_> local_4d;
  int local_4c;
  pair<int,_int> *local_48;
  pair<int,_int> *local_40;
  ulong local_38;
  
  uVar10 = (long)end._M_current - (long)begin >> 3;
  if ((long)uVar10 < 0x18) {
    if (param_4 == 0) {
LAB_00372b21:
      ppVar6 = begin + 1;
      if (begin + 1 == end._M_current || begin == end._M_current) {
        return;
      }
      do {
        ppVar8 = ppVar6;
        iVar14 = begin->first;
        if ((begin[1].first < iVar14) ||
           ((begin[1].first <= iVar14 && (begin[1].second < begin->second)))) {
          pVar1 = *ppVar8;
          do {
            do {
              ppVar6 = begin;
              ppVar6[1].first = iVar14;
              iVar14 = ppVar6[-1].first;
              ppVar6[1].second = ppVar6->second;
              iVar2 = pVar1.first;
              begin = ppVar6 + -1;
            } while (iVar2 < iVar14);
            iVar12 = pVar1.second;
          } while ((iVar2 <= iVar14) && (iVar12 < ppVar6[-1].second));
          ppVar6->first = iVar2;
          ppVar6->second = iVar12;
        }
        ppVar6 = ppVar8 + 1;
        begin = ppVar8;
      } while (ppVar8 + 1 != end._M_current);
      return;
    }
  }
  else {
    local_40 = end._M_current + -1;
    __first._M_current = begin;
    local_4c = param_3;
    local_48 = end._M_current;
    do {
      uVar4 = uVar10 >> 1;
      if (uVar10 < 0x81) {
        iVar2 = (__first._M_current)->first;
        iVar14 = __first._M_current[uVar4].first;
        if (iVar2 < iVar14) {
          iVar12 = __first._M_current[uVar4].second;
          iVar9 = (__first._M_current)->second;
LAB_0037232c:
          __first._M_current[uVar4].first = iVar2;
          (__first._M_current)->first = iVar14;
          __first._M_current[uVar4].second = iVar9;
          (__first._M_current)->second = iVar12;
          iVar2 = iVar14;
        }
        else if (iVar2 <= iVar14) {
          iVar9 = (__first._M_current)->second;
          iVar12 = __first._M_current[uVar4].second;
          if (iVar9 < iVar12) goto LAB_0037232c;
        }
        iVar14 = local_40->first;
        if ((iVar14 < iVar2) ||
           ((iVar14 <= iVar2 && (end._M_current[-1].second < (__first._M_current)->second)))) {
          (__first._M_current)->first = iVar14;
          end._M_current[-1].first = iVar2;
          iVar14 = (__first._M_current)->second;
          (__first._M_current)->second = end._M_current[-1].second;
          end._M_current[-1].second = iVar14;
          iVar2 = (__first._M_current)->first;
        }
        iVar14 = __first._M_current[uVar4].first;
        if (iVar2 < iVar14) {
          iVar12 = __first._M_current[uVar4].second;
          iVar9 = (__first._M_current)->second;
LAB_00372404:
          __first._M_current[uVar4].first = iVar2;
          (__first._M_current)->first = iVar14;
          __first._M_current[uVar4].second = iVar9;
          (__first._M_current)->second = iVar12;
        }
        else if (iVar2 <= iVar14) {
          iVar9 = (__first._M_current)->second;
          iVar12 = __first._M_current[uVar4].second;
          if (iVar9 < iVar12) goto LAB_00372404;
        }
      }
      else {
        iVar2 = __first._M_current[uVar4].first;
        iVar14 = (__first._M_current)->first;
        if (iVar2 < iVar14) {
          iVar12 = (__first._M_current)->second;
          iVar9 = __first._M_current[uVar4].second;
LAB_00372302:
          (__first._M_current)->first = iVar2;
          __first._M_current[uVar4].first = iVar14;
          (__first._M_current)->second = iVar9;
          __first._M_current[uVar4].second = iVar12;
          iVar2 = iVar14;
        }
        else if (iVar2 <= iVar14) {
          iVar9 = __first._M_current[uVar4].second;
          iVar12 = (__first._M_current)->second;
          if (iVar9 < iVar12) goto LAB_00372302;
        }
        iVar14 = local_40->first;
        if ((iVar14 < iVar2) ||
           ((iVar14 <= iVar2 && (end._M_current[-1].second < __first._M_current[uVar4].second)))) {
          __first._M_current[uVar4].first = iVar14;
          end._M_current[-1].first = iVar2;
          iVar14 = __first._M_current[uVar4].second;
          __first._M_current[uVar4].second = end._M_current[-1].second;
          end._M_current[-1].second = iVar14;
          iVar2 = __first._M_current[uVar4].first;
        }
        iVar14 = (__first._M_current)->first;
        if (iVar2 < iVar14) {
          iVar12 = (__first._M_current)->second;
          iVar9 = __first._M_current[uVar4].second;
LAB_003723d1:
          (__first._M_current)->first = iVar2;
          __first._M_current[uVar4].first = iVar14;
          (__first._M_current)->second = iVar9;
          __first._M_current[uVar4].second = iVar12;
        }
        else if (iVar2 <= iVar14) {
          iVar9 = __first._M_current[uVar4].second;
          iVar12 = (__first._M_current)->second;
          if (iVar9 < iVar12) goto LAB_003723d1;
        }
        iVar2 = __first._M_current[uVar4 - 1].first;
        iVar14 = __first._M_current[1].first;
        if (iVar2 < iVar14) {
          iVar12 = __first._M_current[1].second;
          iVar9 = __first._M_current[uVar4 - 1].second;
LAB_00372443:
          __first._M_current[1].first = iVar2;
          __first._M_current[uVar4 - 1].first = iVar14;
          __first._M_current[1].second = iVar9;
          __first._M_current[uVar4 - 1].second = iVar12;
          iVar2 = iVar14;
        }
        else if (iVar2 <= iVar14) {
          iVar9 = __first._M_current[uVar4 - 1].second;
          iVar12 = __first._M_current[1].second;
          if (iVar9 < iVar12) goto LAB_00372443;
        }
        iVar14 = end._M_current[-2].first;
        if ((iVar14 < iVar2) ||
           ((iVar14 <= iVar2 && (end._M_current[-2].second < __first._M_current[uVar4 - 1].second)))
           ) {
          __first._M_current[uVar4 - 1].first = iVar14;
          end._M_current[-2].first = iVar2;
          iVar14 = __first._M_current[uVar4 - 1].second;
          __first._M_current[uVar4 - 1].second = end._M_current[-2].second;
          end._M_current[-2].second = iVar14;
          iVar2 = __first._M_current[uVar4 - 1].first;
        }
        iVar14 = __first._M_current[1].first;
        if (iVar2 < iVar14) {
          iVar12 = __first._M_current[1].second;
          iVar9 = __first._M_current[uVar4 - 1].second;
LAB_003724ce:
          __first._M_current[1].first = iVar2;
          __first._M_current[uVar4 - 1].first = iVar14;
          __first._M_current[1].second = iVar9;
          __first._M_current[uVar4 - 1].second = iVar12;
        }
        else if (iVar2 <= iVar14) {
          iVar9 = __first._M_current[uVar4 - 1].second;
          iVar12 = __first._M_current[1].second;
          if (iVar9 < iVar12) goto LAB_003724ce;
        }
        iVar2 = __first._M_current[uVar4 + 1].first;
        iVar14 = __first._M_current[2].first;
        if (iVar2 < iVar14) {
          iVar12 = __first._M_current[2].second;
          iVar9 = __first._M_current[uVar4 + 1].second;
LAB_0037250c:
          __first._M_current[2].first = iVar2;
          __first._M_current[uVar4 + 1].first = iVar14;
          __first._M_current[2].second = iVar9;
          __first._M_current[uVar4 + 1].second = iVar12;
          iVar2 = iVar14;
        }
        else if (iVar2 <= iVar14) {
          iVar9 = __first._M_current[uVar4 + 1].second;
          iVar12 = __first._M_current[2].second;
          if (iVar9 < iVar12) goto LAB_0037250c;
        }
        iVar14 = end._M_current[-3].first;
        if ((iVar14 < iVar2) ||
           ((iVar14 <= iVar2 && (end._M_current[-3].second < __first._M_current[uVar4 + 1].second)))
           ) {
          __first._M_current[uVar4 + 1].first = iVar14;
          end._M_current[-3].first = iVar2;
          iVar14 = __first._M_current[uVar4 + 1].second;
          __first._M_current[uVar4 + 1].second = end._M_current[-3].second;
          end._M_current[-3].second = iVar14;
          iVar2 = __first._M_current[uVar4 + 1].first;
        }
        iVar14 = __first._M_current[2].first;
        if (iVar2 < iVar14) {
          iVar12 = __first._M_current[2].second;
          iVar9 = __first._M_current[uVar4 + 1].second;
LAB_0037257e:
          __first._M_current[2].first = iVar2;
          __first._M_current[uVar4 + 1].first = iVar14;
          __first._M_current[2].second = iVar9;
          __first._M_current[uVar4 + 1].second = iVar12;
          iVar2 = iVar14;
        }
        else if (iVar2 <= iVar14) {
          iVar9 = __first._M_current[uVar4 + 1].second;
          iVar12 = __first._M_current[2].second;
          if (iVar9 < iVar12) goto LAB_0037257e;
        }
        iVar12 = __first._M_current[uVar4 - 1].first;
        iVar14 = __first._M_current[uVar4].first;
        if (iVar14 < iVar12) {
          iVar7 = __first._M_current[uVar4 - 1].second;
          iVar15 = __first._M_current[uVar4].second;
LAB_003725bd:
          __first._M_current[uVar4 - 1].first = iVar14;
          __first._M_current[uVar4].first = iVar12;
          __first._M_current[uVar4 - 1].second = iVar15;
          __first._M_current[uVar4].second = iVar7;
          iVar9 = iVar12;
          iVar12 = iVar14;
        }
        else {
          iVar9 = iVar14;
          if (iVar14 <= iVar12) {
            iVar7 = __first._M_current[uVar4 - 1].second;
            iVar15 = __first._M_current[uVar4].second;
            if (iVar15 < iVar7) goto LAB_003725bd;
          }
        }
        if (iVar2 < iVar9) {
          iVar14 = __first._M_current[uVar4].second;
          iVar7 = __first._M_current[uVar4 + 1].second;
LAB_003725f7:
          __first._M_current[uVar4].first = iVar2;
          __first._M_current[uVar4 + 1].first = iVar9;
          __first._M_current[uVar4].second = iVar7;
          __first._M_current[uVar4 + 1].second = iVar14;
          iVar9 = iVar2;
        }
        else if (iVar2 <= iVar9) {
          iVar14 = __first._M_current[uVar4].second;
          iVar7 = __first._M_current[uVar4 + 1].second;
          if (iVar7 < iVar14) goto LAB_003725f7;
        }
        if (iVar9 < iVar12) {
          iVar2 = __first._M_current[uVar4 - 1].second;
          iVar14 = __first._M_current[uVar4].second;
LAB_0037262d:
          __first._M_current[uVar4 - 1].first = iVar9;
          __first._M_current[uVar4].first = iVar12;
          __first._M_current[uVar4 - 1].second = iVar14;
          __first._M_current[uVar4].second = iVar2;
          iVar9 = iVar12;
          iVar14 = iVar2;
        }
        else {
          iVar14 = __first._M_current[uVar4].second;
          if ((iVar9 <= iVar12) && (iVar2 = __first._M_current[uVar4 - 1].second, iVar14 < iVar2))
          goto LAB_0037262d;
        }
        (__first._M_current)->first = iVar9;
        (__first._M_current)->second = iVar14;
        __first._M_current[uVar4] = *__first._M_current;
      }
      if ((param_4 & 1) == 0) {
        if ((__first._M_current[-1].first < (__first._M_current)->first) ||
           ((__first._M_current[-1].first <= (__first._M_current)->first &&
            (__first._M_current[-1].second < (__first._M_current)->second)))) goto LAB_0037267e;
        lVar3 = 0;
        while( true ) {
          iVar14 = *(int *)((long)&local_40->first + lVar3);
          iVar2 = (*__first._M_current).first;
          if ((iVar14 <= iVar2) &&
             ((iVar12 = (*__first._M_current).second, iVar14 < iVar2 ||
              (*(int *)((long)&local_40->second + lVar3) <= iVar12)))) break;
          lVar3 = lVar3 + -8;
        }
        begin = (pair<int,_int> *)((long)&local_40->first + lVar3);
        if (lVar3 == 0) {
          _Var5._M_current = __first._M_current;
          iVar9 = iVar2;
          if (__first._M_current < begin) {
            iVar9 = __first._M_current[1].first;
            _Var13._M_current = __first._M_current;
            while (_Var5._M_current = _Var13._M_current + 1, iVar9 <= iVar2) {
              if (iVar9 < iVar2) {
                if (begin <= _Var5._M_current) break;
              }
              else if ((begin <= _Var5._M_current) || (iVar12 < _Var13._M_current[1].second)) break;
              iVar9 = _Var13._M_current[2].first;
              _Var13._M_current = _Var5._M_current;
            }
          }
        }
        else {
          iVar9 = __first._M_current[1].first;
          _Var13._M_current = __first._M_current;
          while ((_Var5._M_current = _Var13._M_current + 1, iVar9 <= iVar2 &&
                 ((iVar9 < iVar2 || (_Var13._M_current[1].second <= iVar12))))) {
            iVar9 = _Var13._M_current[2].first;
            _Var13._M_current = _Var5._M_current;
          }
        }
LAB_00372ae0:
        if (_Var5._M_current < begin) {
          (_Var5._M_current)->first = iVar14;
          begin->first = iVar9;
          iVar14 = (_Var5._M_current)->second;
          (_Var5._M_current)->second = begin->second;
          begin->second = iVar14;
          do {
            do {
              ppVar6 = begin;
              begin = ppVar6 + -1;
              iVar14 = begin->first;
            } while (iVar2 < iVar14);
          } while ((iVar2 <= iVar14) && (iVar12 < ppVar6[-1].second));
          do {
            ppVar6 = _Var5._M_current;
            iVar9 = ppVar6[1].first;
            _Var5._M_current = ppVar6 + 1;
            if (iVar2 < iVar9) break;
          } while ((iVar9 < iVar2) || (ppVar6[1].second <= iVar12));
          goto LAB_00372ae0;
        }
        (__first._M_current)->first = iVar14;
        (__first._M_current)->second = begin->second;
        begin->first = iVar2;
        begin->second = iVar12;
        begin = begin + 1;
        uVar10 = (long)end._M_current - (long)begin >> 3;
      }
      else {
LAB_0037267e:
        pVar19 = partition_right<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
                           (__first._M_current);
        _Var5 = pVar19.first._M_current;
        uVar4 = (long)_Var5._M_current - (long)__first._M_current >> 3;
        begin = _Var5._M_current + 1;
        local_38 = (long)end._M_current - (long)begin >> 3;
        if (((long)uVar4 < (long)(uVar10 >> 3)) || ((long)local_38 < (long)(uVar10 >> 3))) {
          local_4c = local_4c + -1;
          if (local_4c == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<int,int>>>>
                      (__first,end,&local_4e);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::pair<int,int>>>>
                      (__first,end,&local_4d);
            return;
          }
          if (0x17 < (long)uVar4) {
            uVar10 = uVar4 >> 2;
            pVar1 = *__first._M_current;
            *__first._M_current = __first._M_current[uVar10];
            __first._M_current[uVar10] = pVar1;
            pVar1 = _Var5._M_current[-1];
            _Var5._M_current[-1] = _Var5._M_current[-uVar10];
            _Var5._M_current[-uVar10] = pVar1;
            if (0x80 < uVar4) {
              pVar1 = __first._M_current[1];
              __first._M_current[1] = __first._M_current[uVar10 + 1];
              __first._M_current[uVar10 + 1] = pVar1;
              pVar1 = __first._M_current[2];
              __first._M_current[2] = __first._M_current[uVar10 + 2];
              __first._M_current[uVar10 + 2] = pVar1;
              pVar1 = _Var5._M_current[-2];
              _Var5._M_current[-2] = _Var5._M_current[~uVar10];
              _Var5._M_current[~uVar10] = pVar1;
              pVar1 = _Var5._M_current[-3];
              _Var5._M_current[-3] = _Var5._M_current[-2 - uVar10];
              _Var5._M_current[-2 - uVar10] = pVar1;
            }
          }
          if (0x17 < (long)local_38) {
            uVar10 = local_38 >> 2;
            pVar1 = _Var5._M_current[1];
            _Var5._M_current[1] = _Var5._M_current[uVar10 + 1];
            _Var5._M_current[uVar10 + 1] = pVar1;
            pVar1 = end._M_current[-1];
            end._M_current[-1] = end._M_current[-uVar10];
            end._M_current[-uVar10] = pVar1;
            if (0x80 < local_38) {
              pVar1 = _Var5._M_current[2];
              _Var5._M_current[2] = _Var5._M_current[uVar10 + 2];
              _Var5._M_current[uVar10 + 2] = pVar1;
              pVar1 = _Var5._M_current[3];
              _Var5._M_current[3] = _Var5._M_current[uVar10 + 3];
              _Var5._M_current[uVar10 + 3] = pVar1;
              pVar1 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar10];
              end._M_current[~uVar10] = pVar1;
              pVar1 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar10];
              end._M_current[-2 - uVar10] = pVar1;
            }
          }
        }
        else if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (__first._M_current + 1 != _Var5._M_current && __first._M_current != _Var5._M_current)
          {
            lVar3 = 0;
            uVar10 = 0;
            _Var13._M_current = __first._M_current;
            ppVar6 = __first._M_current + 1;
            do {
              iVar14 = (_Var13._M_current)->first;
              if ((_Var13._M_current[1].first < iVar14) ||
                 ((_Var13._M_current[1].first <= iVar14 &&
                  (_Var13._M_current[1].second < (_Var13._M_current)->second)))) {
                pVar1 = _Var13._M_current[1];
                _Var13._M_current[1].first = iVar14;
                ppVar6->second = (_Var13._M_current)->second;
                iVar2 = pVar1.second;
                iVar14 = pVar1.first;
                ppVar8 = ppVar6 + -1;
                _Var13._M_current = __first._M_current;
                ppVar18 = ppVar6;
                lVar17 = lVar3;
                if (ppVar6 + -1 != __first._M_current) {
                  do {
                    ppVar16 = ppVar8;
                    iVar12 = ppVar16[-1].first;
                    if (iVar14 < iVar12) {
                      iVar9 = ppVar16[-1].second;
                    }
                    else {
                      _Var13._M_current = ppVar16;
                      if (iVar12 < iVar14) {
                        ppVar18 = ppVar16 + 1;
                        end._M_current = local_48;
                        break;
                      }
                      iVar9 = ppVar16[-1].second;
                      end._M_current = local_48;
                      if (iVar9 <= iVar2) break;
                    }
                    ppVar16->first = iVar12;
                    ppVar16->second = iVar9;
                    lVar17 = lVar17 + 8;
                    ppVar8 = ppVar16 + -1;
                    _Var13._M_current = __first._M_current;
                    ppVar18 = ppVar16;
                    end._M_current = local_48;
                  } while (lVar17 != 0);
                }
                (_Var13._M_current)->first = iVar14;
                ppVar18[-1].second = iVar2;
                uVar10 = uVar10 + ((long)ppVar6 - (long)_Var13._M_current >> 3);
                if (8 < uVar10) goto LAB_003729e0;
              }
              ppVar8 = ppVar6 + 1;
              lVar3 = lVar3 + -8;
              _Var13._M_current = ppVar6;
              ppVar6 = ppVar8;
            } while (ppVar8 != _Var5._M_current);
          }
          if (begin == end._M_current) {
            return;
          }
          if (_Var5._M_current + 2 == end._M_current) {
            return;
          }
          lVar3 = 0x10;
          lVar17 = 0;
          uVar10 = 0;
          ppVar6 = begin;
          do {
            ppVar8 = (pair<int,_int> *)((long)&(_Var5._M_current)->first + lVar3);
            iVar14 = *(int *)((long)&(_Var5._M_current)->first + lVar3);
            iVar2 = ppVar6->first;
            if ((iVar14 < iVar2) || ((iVar14 <= iVar2 && (ppVar6[1].second < ppVar6->second)))) {
              ppVar8->first = iVar2;
              ppVar8->second = ppVar6->second;
              iVar2 = (*ppVar8).second;
              iVar14 = (*ppVar8).first;
              ppVar6 = begin;
              ppVar18 = ppVar8;
              if (lVar3 != 0x10) {
                lVar11 = lVar17;
                ppVar16 = (pair<int,_int> *)((long)&_Var5._M_current[-1].first + lVar3);
                do {
                  iVar12 = ppVar16[-1].first;
                  if (iVar14 < iVar12) {
                    iVar9 = ppVar16[-1].second;
                  }
                  else {
                    ppVar6 = ppVar16;
                    if (iVar12 < iVar14) {
                      ppVar18 = ppVar16 + 1;
                      end._M_current = local_48;
                      break;
                    }
                    iVar9 = ppVar16[-1].second;
                    end._M_current = local_48;
                    if (iVar9 <= iVar2) break;
                  }
                  ppVar16->first = iVar12;
                  ppVar16->second = iVar9;
                  lVar11 = lVar11 + 8;
                  ppVar6 = begin;
                  ppVar18 = ppVar16;
                  ppVar16 = ppVar16 + -1;
                  end._M_current = local_48;
                } while (lVar11 != 0);
              }
              ppVar6->first = iVar14;
              ppVar18[-1].second = iVar2;
              uVar10 = uVar10 + ((long)ppVar8 - (long)ppVar6 >> 3);
              if (8 < uVar10) break;
            }
            ppVar18 = (pair<int,_int> *)((long)&_Var5._M_current[1].first + lVar3);
            lVar3 = lVar3 + 8;
            lVar17 = lVar17 + -8;
            ppVar6 = ppVar8;
            if (ppVar18 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_003729e0:
        pdqsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>,false>
                  (__first._M_current,_Var5._M_current,local_4c,param_4 & 1);
        param_4 = 0;
        uVar10 = local_38;
      }
      __first._M_current = begin;
    } while (0x17 < (long)uVar10);
    if ((param_4 & 1) == 0) goto LAB_00372b21;
  }
  if (begin + 1 != end._M_current && begin != end._M_current) {
    lVar3 = 0;
    ppVar6 = begin;
    ppVar8 = begin + 1;
    do {
      iVar14 = ppVar6->first;
      if ((ppVar6[1].first < iVar14) ||
         ((ppVar6[1].first <= iVar14 && (ppVar6[1].second < ppVar6->second)))) {
        pVar1 = ppVar6[1];
        ppVar18 = ppVar8 + -1;
        ppVar6[1].first = iVar14;
        ppVar8->second = ppVar6->second;
        iVar2 = pVar1.second;
        iVar14 = pVar1.first;
        ppVar6 = begin;
        ppVar16 = ppVar8;
        lVar17 = lVar3;
        if (ppVar18 != begin) {
          do {
            iVar12 = ppVar18[-1].first;
            if (iVar14 < iVar12) {
              iVar9 = ppVar18[-1].second;
            }
            else {
              ppVar6 = ppVar18;
              if (iVar12 < iVar14) {
                ppVar16 = ppVar18 + 1;
                break;
              }
              iVar9 = ppVar18[-1].second;
              if (iVar9 <= iVar2) break;
            }
            ppVar18->first = iVar12;
            ppVar18->second = iVar9;
            lVar17 = lVar17 + 8;
            ppVar6 = begin;
            ppVar16 = ppVar18;
            ppVar18 = ppVar18 + -1;
          } while (lVar17 != 0);
        }
        ppVar6->first = iVar14;
        ppVar16[-1].second = iVar2;
      }
      ppVar18 = ppVar8 + 1;
      lVar3 = lVar3 + -8;
      ppVar6 = ppVar8;
      ppVar8 = ppVar18;
    } while (ppVar18 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }